

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoGenericBoxed.cpp
# Opt level: O3

ChConstraintTwoGenericBoxed * __thiscall
chrono::ChConstraintTwoGenericBoxed::operator=
          (ChConstraintTwoGenericBoxed *this,ChConstraintTwoGenericBoxed *other)

{
  double dVar1;
  
  if (other != this) {
    ChConstraintTwoGeneric::operator=
              (&this->super_ChConstraintTwoGeneric,&other->super_ChConstraintTwoGeneric);
    dVar1 = other->l_max;
    this->l_min = other->l_min;
    this->l_max = dVar1;
  }
  return this;
}

Assistant:

ChConstraintTwoGenericBoxed& ChConstraintTwoGenericBoxed::operator=(const ChConstraintTwoGenericBoxed& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChConstraintTwoGeneric::operator=(other);

    l_min = other.l_min;
    l_max = other.l_max;

    return *this;
}